

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
          (cmFileListGeneratorCaseInsensitive *this,cmFileListGeneratorCaseInsensitive *r)

{
  cmFileListGeneratorCaseInsensitive *r_local;
  cmFileListGeneratorCaseInsensitive *this_local;
  
  cmFileListGeneratorBase::cmFileListGeneratorBase(&this->super_cmFileListGeneratorBase);
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorCaseInsensitive_00ae4278;
  std::__cxx11::string::string((string *)&this->String,(string *)&r->String);
  return;
}

Assistant:

cmFileListGeneratorCaseInsensitive(
    cmFileListGeneratorCaseInsensitive const& r)
    : String(r.String)
  {
  }